

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O2

bool __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::try_increase_info(Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
                    *this)

{
  uint uVar1;
  uint8_t *puVar2;
  size_t i;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar1 = this->mInfoInc;
  if (2 < uVar1) {
    this->mInfoInc = uVar1 >> 1 & 0xff;
    this->mInfoHashShift = this->mInfoHashShift + 1;
    uVar4 = this->mMask + 1;
    if (uVar4 < 0x28f5c28f5c28f5d) {
      uVar3 = (uVar4 * 0x50) / 100;
    }
    else {
      uVar3 = (uVar4 / 100) * 0x50;
    }
    uVar5 = 0xff;
    if (uVar3 < 0xff) {
      uVar5 = uVar3;
    }
    for (uVar3 = 0; puVar2 = this->mInfo, uVar3 < uVar5 + uVar4; uVar3 = uVar3 + 8) {
      *(ulong *)(puVar2 + uVar3) = *(ulong *)(puVar2 + uVar3) >> 1 & 0x7f7f7f7f7f7f7f7f;
    }
    puVar2[uVar5 + uVar4] = '\x01';
    uVar4 = this->mMask + 1;
    if (uVar4 < 0x28f5c28f5c28f5d) {
      uVar4 = (uVar4 * 0x50) / 100;
    }
    else {
      uVar4 = (uVar4 / 100) * 0x50;
    }
    this->mMaxNumElementsAllowed = uVar4;
  }
  return 2 < uVar1;
}

Assistant:

bool try_increase_info() {
        ROBIN_HOOD_LOG("mInfoInc=" << mInfoInc << ", numElements=" << mNumElements
                                   << ", maxNumElementsAllowed="
                                   << calcMaxNumElementsAllowed(mMask + 1))
        if (mInfoInc <= 2) {
            // need to be > 2 so that shift works (otherwise undefined behavior!)
            return false;
        }
        // we got space left, try to make info smaller
        mInfoInc = static_cast<uint8_t>(mInfoInc >> 1U);

        // remove one bit of the hash, leaving more space for the distance info.
        // This is extremely fast because we can operate on 8 bytes at once.
        ++mInfoHashShift;
        auto const numElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        for (size_t i = 0; i < numElementsWithBuffer; i += 8) {
            auto val = unaligned_load<uint64_t>(mInfo + i);
            val = (val >> 1U) & UINT64_C(0x7f7f7f7f7f7f7f7f);
            std::memcpy(mInfo + i, &val, sizeof(val));
        }
        // update sentinel, which might have been cleared out!
        mInfo[numElementsWithBuffer] = 1;

        mMaxNumElementsAllowed = calcMaxNumElementsAllowed(mMask + 1);
        return true;
    }